

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_branch_elim_pass.cpp
# Opt level: O2

void __thiscall spvtools::opt::DeadBranchElimPass::FixBlockOrder(DeadBranchElimPass *this)

{
  bool bVar1;
  FeatureManager *pFVar2;
  _Any_data *pfn;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  ProcessFunction reorder_structured;
  
  IRContext::BuildInvalidAnalyses
            ((this->super_MemPass).super_Pass.context_,kAnalysisDominatorAnalysis|kAnalysisCFG);
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/dead_branch_elim_pass.cpp:442:40)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/dead_branch_elim_pass.cpp:442:40)>
             ::_M_manager;
  reorder_structured.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  reorder_structured.super__Function_base._M_functor._8_8_ = 0;
  reorder_structured._M_invoker =
       std::
       _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/dead_branch_elim_pass.cpp:458:40)>
       ::_M_invoke;
  reorder_structured.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/dead_branch_elim_pass.cpp:458:40)>
       ::_M_manager;
  local_58._M_unused._M_object = this;
  pFVar2 = IRContext::get_feature_mgr((this->super_MemPass).super_Pass.context_);
  bVar1 = EnumSet<spv::Capability>::contains(&pFVar2->capabilities_,Shader);
  pfn = &local_58;
  if (bVar1) {
    pfn = (_Any_data *)&reorder_structured;
  }
  IRContext::ProcessReachableCallTree
            ((this->super_MemPass).super_Pass.context_,(ProcessFunction *)pfn);
  if (reorder_structured.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*reorder_structured.super__Function_base._M_manager)
              ((_Any_data *)&reorder_structured,(_Any_data *)&reorder_structured,__destroy_functor);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  return;
}

Assistant:

void DeadBranchElimPass::FixBlockOrder() {
  context()->BuildInvalidAnalyses(IRContext::kAnalysisCFG |
                                  IRContext::kAnalysisDominatorAnalysis);
  // Reorders blocks according to DFS of dominator tree.
  ProcessFunction reorder_dominators = [this](Function* function) {
    DominatorAnalysis* dominators = context()->GetDominatorAnalysis(function);
    std::vector<BasicBlock*> blocks;
    for (auto iter = dominators->GetDomTree().begin();
         iter != dominators->GetDomTree().end(); ++iter) {
      if (iter->id() != 0) {
        blocks.push_back(iter->bb_);
      }
    }
    for (uint32_t i = 1; i < blocks.size(); ++i) {
      function->MoveBasicBlockToAfter(blocks[i]->id(), blocks[i - 1]);
    }
    return true;
  };

  // Reorders blocks according to structured order.
  ProcessFunction reorder_structured = [](Function* function) {
    function->ReorderBasicBlocksInStructuredOrder();
    return true;
  };

  // Structured order is more intuitive so use it where possible.
  if (context()->get_feature_mgr()->HasCapability(spv::Capability::Shader)) {
    context()->ProcessReachableCallTree(reorder_structured);
  } else {
    context()->ProcessReachableCallTree(reorder_dominators);
  }
}